

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O3

amqp_bytes_t amqp_bytes_malloc_dup(amqp_bytes_t src)

{
  void *__dest;
  size_t __size;
  amqp_bytes_t aVar1;
  
  __size = src.len;
  __dest = malloc(__size);
  if (__dest != (void *)0x0) {
    memcpy(__dest,src.bytes,__size);
  }
  aVar1.bytes = __dest;
  aVar1.len = __size;
  return aVar1;
}

Assistant:

amqp_bytes_t amqp_bytes_malloc_dup(amqp_bytes_t src)
{
  amqp_bytes_t result;
  result.len = src.len;
  result.bytes = malloc(src.len);
  if (result.bytes != NULL) {
    memcpy(result.bytes, src.bytes, src.len);
  }
  return result;
}